

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

string * __thiscall
flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
          (string *__return_storage_ptr__,PythonStubGenerator *this,Type *type,Imports *imports)

{
  BaseType BVar1;
  Import *pIVar2;
  string local_80;
  string local_60;
  Type local_40;
  
  if (type->enum_def == (EnumDef *)0x0) {
    BVar1 = type->base_type;
    if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
      ScalarType_abi_cxx11_
                (__return_storage_ptr__,(PythonStubGenerator *)(ulong)BVar1,BASE_TYPE_NONE);
    }
    else {
      switch(BVar1) {
      case BASE_TYPE_STRING:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"str",(allocator<char> *)&local_80);
        break;
      case BASE_TYPE_VECTOR:
      case BASE_TYPE_ARRAY:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"typing",(allocator<char> *)&local_60);
        Imports::Import(imports,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        local_40.base_type = type->element;
        local_40.fixed_length = type->fixed_length;
        local_40.element = BASE_TYPE_NONE;
        local_40.struct_def = type->struct_def;
        local_40.enum_def = type->enum_def;
        TypeOf_abi_cxx11_(&local_60,this,&local_40,imports);
        std::operator+(&local_80,"typing.List[",&local_60);
        std::operator+(__return_storage_ptr__,&local_80,"]");
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        break;
      case BASE_TYPE_STRUCT:
        anon_unknown_0::PythonStubGenerator::ModuleFor<flatbuffers::StructDef>
                  (&local_80,(PythonStubGenerator *)this,type->struct_def);
        (**(code **)(*(long *)(this + 8) + 0x78))(&local_60,this + 8,type->struct_def);
        pIVar2 = Imports::Import(imports,&local_80,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pIVar2->name);
        break;
      case BASE_TYPE_UNION:
        UnionType_abi_cxx11_(__return_storage_ptr__,this,(EnumDef *)0x0,imports);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_python.cpp"
                      ,0xf2,
                      "std::string flatbuffers::python::(anonymous namespace)::PythonStubGenerator::TypeOf(const Type &, Imports *) const"
                     );
      }
    }
  }
  else {
    EnumType_abi_cxx11_(__return_storage_ptr__,this,type->enum_def,imports);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TypeOf(const Type &type, Imports *imports) const {
    if (type.enum_def != nullptr) return EnumType(*type.enum_def, imports);
    if (IsScalar(type.base_type)) return ScalarType(type.base_type);

    switch (type.base_type) {
      case BASE_TYPE_STRUCT: {
        const Import &import = imports->Import(ModuleFor(type.struct_def),
                                               namer_.Type(*type.struct_def));
        return import.name;
      }
      case BASE_TYPE_STRING:
        return "str";
      case BASE_TYPE_ARRAY:
      case BASE_TYPE_VECTOR: {
        imports->Import("typing");
        return "typing.List[" + TypeOf(type.VectorType(), imports) + "]";
      }
      case BASE_TYPE_UNION:
        return UnionType(*type.enum_def, imports);
      default:
        FLATBUFFERS_ASSERT(0);
        return "";
    }
  }